

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_tiledecode(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  uint_fast8_t uVar1;
  jpc_dec_ccp_t *pjVar2;
  jas_image_t *image;
  long lVar3;
  uint_fast32_t uVar4;
  long lVar5;
  ulong uVar6;
  jpc_dec_band_t *pjVar7;
  uint_fast32_t uVar8;
  long lVar9;
  ulong uVar10;
  _Bool _Var11;
  int iVar12;
  uint uVar13;
  jas_matind_t jVar14;
  jas_seqent_t jVar15;
  jas_seqent_t *pjVar16;
  jas_matind_t height;
  byte bVar17;
  int local_d8;
  int local_d4;
  int local_b4;
  jpc_fix_t mx;
  jpc_fix_t mn;
  jas_matind_t j_1;
  jas_matind_t i_1;
  jas_matind_t j;
  jas_matind_t i;
  jpc_dec_cmpt_t *cmpt;
  jpc_dec_ccp_t *ccp;
  int v;
  int adjust;
  int bandno;
  uint rlvlno;
  int compno;
  jpc_dec_band_t *band;
  jpc_dec_rlvl_t *rlvl;
  jpc_dec_tcomp_t *tcomp;
  jpc_dec_tile_t *tile_local;
  jpc_dec_t *dec_local;
  
  iVar12 = jpc_dec_decodecblks(dec,tile);
  if (iVar12 != 0) {
    jas_eprintf("jpc_dec_decodecblks failed\n");
    return -1;
  }
  bandno = 0;
  rlvl = (jpc_dec_rlvl_t *)tile->tcomps;
  for (; bandno < dec->numcomps; bandno = bandno + 1) {
    pjVar2 = tile->cp->ccps;
    adjust = 0;
    band = *(jpc_dec_band_t **)&rlvl->prcwidthexpn;
    for (; (uint)adjust < (uint)rlvl->yend; adjust = adjust + 1) {
      if (band->data != (jas_matrix_t *)0x0) {
        v = 0;
        _rlvlno = band->data;
        for (; v < *(int *)&band->prcs; v = v + 1) {
          if ((_rlvlno->xstart_ != 0) &&
             (jpc_undo_roi((jas_matrix_t *)_rlvlno->xstart_,(int)_rlvlno->numrows_,
                           (uint)pjVar2[bandno].roishift - (int)_rlvlno->numrows_,
                           (int)_rlvlno->yend_), tile->realmode != 0)) {
            jas_matrix_asl((jas_matrix_t *)_rlvlno->xstart_,0xd);
            jpc_dequantize((jas_matrix_t *)_rlvlno->xstart_,_rlvlno->xend_);
          }
          _rlvlno = (jas_matrix_t *)&_rlvlno->numcols_;
        }
      }
      band = band + 2;
    }
    rlvl = (jpc_dec_rlvl_t *)&rlvl->numprcs;
  }
  bandno = 0;
  rlvl = (jpc_dec_rlvl_t *)tile->tcomps;
  for (; bandno < dec->numcomps; bandno = bandno + 1) {
    jpc_tsfb_synthesize(*(jpc_tsfb_t **)&rlvl->numhprcs,(jas_seq2d_t *)rlvl->xend);
    rlvl = (jpc_dec_rlvl_t *)&rlvl->numprcs;
  }
  uVar1 = tile->cp->mctid;
  if (uVar1 == '\x01') {
    if (dec->numcomps < 3) {
      jas_eprintf("ICT requires at least three components\n");
      return -1;
    }
    _Var11 = jas_image_cmpt_domains_same(dec->image);
    if (!_Var11) {
      jas_eprintf("RCT requires all components have the same domain\n");
      return -1;
    }
    jpc_iict(tile->tcomps->data,tile->tcomps[1].data,tile->tcomps[2].data);
  }
  else if (uVar1 == '\x02') {
    if (dec->numcomps < 3) {
      jas_eprintf("RCT requires at least three components\n");
      return -1;
    }
    _Var11 = jas_image_cmpt_domains_same(dec->image);
    if (!_Var11) {
      jas_eprintf("RCT requires all components have the same domain\n");
      return -1;
    }
    jpc_irct(tile->tcomps->data,tile->tcomps[1].data,tile->tcomps[2].data);
  }
  if (tile->realmode != 0) {
    bandno = 0;
    rlvl = (jpc_dec_rlvl_t *)tile->tcomps;
    for (; bandno < dec->numcomps; bandno = bandno + 1) {
      for (j = 0; jVar14 = jas_matrix_numrows((jas_matrix_t *)rlvl->xend), j < jVar14; j = j + 1) {
        for (i_1 = 0; jVar14 = jas_matrix_numcols((jas_matrix_t *)rlvl->xend), i_1 < jVar14;
            i_1 = i_1 + 1) {
          jVar15 = jas_matrix_get((jas_matrix_t *)rlvl->xend,j,i_1);
          iVar12 = (int)jVar15;
          if (iVar12 < 0) {
            uVar13 = iVar12 + 0x1000U & 0xffffe000;
          }
          else {
            uVar13 = -(0x1000U - iVar12 & 0xffffe000);
          }
          jas_matrix_set((jas_matrix_t *)rlvl->xend,j,i_1,(long)((int)uVar13 >> 0xd));
        }
      }
      rlvl = (jpc_dec_rlvl_t *)&rlvl->numprcs;
    }
  }
  bandno = 0;
  rlvl = (jpc_dec_rlvl_t *)tile->tcomps;
  i = (jas_matind_t)dec->cmpts;
  for (; bandno < dec->numcomps; bandno = bandno + 1) {
    if ((*(byte *)(i + 0x28) & 1) == 0) {
      local_b4 = 1 << ((char)*(undefined8 *)(i + 0x20) - 1U & 0x1f);
    }
    else {
      local_b4 = 0;
    }
    for (j_1 = 0; jVar14 = jas_matrix_numrows((jas_matrix_t *)rlvl->xend), j_1 < jVar14;
        j_1 = j_1 + 1) {
      for (mn = 0; jVar14 = jas_matrix_numcols((jas_matrix_t *)rlvl->xend), mn < jVar14; mn = mn + 1
          ) {
        pjVar16 = jas_matrix_getref((jas_matrix_t *)rlvl->xend,j_1,mn);
        *pjVar16 = (long)local_b4 + *pjVar16;
      }
    }
    rlvl = (jpc_dec_rlvl_t *)&rlvl->numprcs;
    i = i + 0x40;
  }
  bandno = 0;
  rlvl = (jpc_dec_rlvl_t *)tile->tcomps;
  i = (jas_matind_t)dec->cmpts;
  for (; bandno < dec->numcomps; bandno = bandno + 1) {
    if ((*(byte *)(i + 0x28) & 1) == 0) {
      local_d4 = 0;
    }
    else {
      local_d4 = -(1 << ((char)*(undefined8 *)(i + 0x20) - 1U & 0x1f));
    }
    if ((*(byte *)(i + 0x28) & 1) == 0) {
      bVar17 = (byte)*(undefined8 *)(i + 0x20);
    }
    else {
      bVar17 = (char)*(undefined8 *)(i + 0x20) - 1;
    }
    local_d8 = (1 << (bVar17 & 0x1f)) + -1;
    jas_matrix_clip((jas_matrix_t *)rlvl->xend,(long)local_d4,(long)local_d8);
    rlvl = (jpc_dec_rlvl_t *)&rlvl->numprcs;
    i = i + 0x40;
  }
  bandno = 0;
  rlvl = (jpc_dec_rlvl_t *)tile->tcomps;
  i = (jas_matind_t)dec->cmpts;
  while( true ) {
    if (dec->numcomps <= bandno) {
      return 0;
    }
    image = dec->image;
    lVar3 = *(long *)rlvl;
    uVar4 = dec->xstart;
    lVar5 = *(long *)i;
    uVar6 = *(ulong *)i;
    pjVar7 = rlvl->bands;
    uVar8 = dec->ystart;
    lVar9 = *(long *)(i + 8);
    uVar10 = *(ulong *)(i + 8);
    jVar14 = jas_matrix_numcols((jas_matrix_t *)rlvl->xend);
    height = jas_matrix_numrows((jas_matrix_t *)rlvl->xend);
    iVar12 = jas_image_writecmpt(image,bandno,lVar3 - ((uVar4 + lVar5) - 1) / uVar6,
                                 (long)pjVar7 - ((uVar8 + lVar9) - 1) / uVar10,jVar14,height,
                                 (jas_matrix_t *)rlvl->xend);
    if (iVar12 != 0) break;
    bandno = bandno + 1;
    rlvl = (jpc_dec_rlvl_t *)&rlvl->numprcs;
    i = i + 0x40;
  }
  jas_eprintf("write component failed\n");
  return -1;
}

Assistant:

static int jpc_dec_tiledecode(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	jpc_dec_rlvl_t *rlvl;
	jpc_dec_band_t *band;
	int compno;
	unsigned rlvlno;
	int bandno;
	int adjust;
	int v;
	jpc_dec_ccp_t *ccp;
	jpc_dec_cmpt_t *cmpt;

	if (jpc_dec_decodecblks(dec, tile)) {
		jas_eprintf("jpc_dec_decodecblks failed\n");
		return -1;
	}

	/* Perform dequantization. */
	for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
	  ++compno, ++tcomp) {
		ccp = &tile->cp->ccps[compno];
		for (rlvlno = 0, rlvl = tcomp->rlvls; rlvlno < tcomp->numrlvls;
		  ++rlvlno, ++rlvl) {
			if (!rlvl->bands) {
				continue;
			}
			for (bandno = 0, band = rlvl->bands;
			  bandno < rlvl->numbands; ++bandno, ++band) {
				if (!band->data) {
					continue;
				}
				jpc_undo_roi(band->data, band->roishift, ccp->roishift -
				  band->roishift, band->numbps);
				if (tile->realmode) {
					jas_matrix_asl(band->data, JPC_FIX_FRACBITS);
					jpc_dequantize(band->data, band->absstepsize);
				}

			}
		}
	}

	/* Apply an inverse wavelet transform if necessary. */
	for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
	  ++compno, ++tcomp) {
		ccp = &tile->cp->ccps[compno];
		jpc_tsfb_synthesize(tcomp->tsfb, tcomp->data);
	}


	/* Apply an inverse intercomponent transform if necessary. */
	switch (tile->cp->mctid) {
	case JPC_MCT_RCT:
		if (dec->numcomps < 3) {
			jas_eprintf("RCT requires at least three components\n");
			return -1;
		}
		if (!jas_image_cmpt_domains_same(dec->image)) {
			jas_eprintf("RCT requires all components have the same domain\n");
			return -1;
		}
		jpc_irct(tile->tcomps[0].data, tile->tcomps[1].data,
		  tile->tcomps[2].data);
		break;
	case JPC_MCT_ICT:
		if (dec->numcomps < 3) {
			jas_eprintf("ICT requires at least three components\n");
			return -1;
		}
		if (!jas_image_cmpt_domains_same(dec->image)) {
			jas_eprintf("RCT requires all components have the same domain\n");
			return -1;
		}
		jpc_iict(tile->tcomps[0].data, tile->tcomps[1].data,
		  tile->tcomps[2].data);
		break;
	}

	/* Perform rounding and convert to integer values. */
	if (tile->realmode) {
		for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
		  ++compno, ++tcomp) {
			for (jas_matind_t i = 0; i < jas_matrix_numrows(tcomp->data); ++i) {
				for (jas_matind_t j = 0; j < jas_matrix_numcols(tcomp->data); ++j) {
					v = jas_matrix_get(tcomp->data, i, j);
					v = jpc_fix_round(v);
					jas_matrix_set(tcomp->data, i, j, jpc_fixtoint(v));
				}
			}
		}
	}

	/* Perform level shift. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		adjust = cmpt->sgnd ? 0 : (1 << (cmpt->prec - 1));
		for (jas_matind_t i = 0; i < jas_matrix_numrows(tcomp->data); ++i) {
			for (jas_matind_t j = 0; j < jas_matrix_numcols(tcomp->data); ++j) {
				*jas_matrix_getref(tcomp->data, i, j) += adjust;
			}
		}
	}

	/* Perform clipping. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		jpc_fix_t mn;
		jpc_fix_t mx;
		mn = cmpt->sgnd ? (-(1 << (cmpt->prec - 1))) : (0);
		mx = cmpt->sgnd ? ((1 << (cmpt->prec - 1)) - 1) : ((1 <<
		  cmpt->prec) - 1);
		jas_matrix_clip(tcomp->data, mn, mx);
	}

	/* XXX need to free tsfb struct */

	/* Write the data for each component of the image. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		if (jas_image_writecmpt(dec->image, compno, tcomp->xstart -
		  JPC_CEILDIV(dec->xstart, cmpt->hstep), tcomp->ystart -
		  JPC_CEILDIV(dec->ystart, cmpt->vstep), jas_matrix_numcols(
		  tcomp->data), jas_matrix_numrows(tcomp->data), tcomp->data)) {
			jas_eprintf("write component failed\n");
			return -1;
		}
	}

	return 0;
}